

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall
DLevelScript::DoSetActorProperty(DLevelScript *this,AActor *actor,int property,int value)

{
  player_t *ppVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  VMScriptFunction *pVVar7;
  uint uVar8;
  AActor *pAVar9;
  
  if (actor == (AActor *)0x0) {
    return;
  }
  switch(property) {
  case 0:
    if (actor->health < 1) {
      return;
    }
    ppVar1 = actor->player;
    if (ppVar1 == (player_t *)0x0) {
      actor->health = value;
    }
    else {
      if (ppVar1->playerstate == '\x01') {
        return;
      }
      actor->health = value;
      ppVar1->health = value;
    }
    if (0 < value) {
      return;
    }
    pAVar9 = (this->activator).field_0.p;
    if (pAVar9 != (AActor *)0x0) {
      if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0050e762;
      (this->activator).field_0.p = (AActor *)0x0;
    }
    pAVar9 = (AActor *)0x0;
LAB_0050e762:
    (*(actor->super_DThinker).super_DObject._vptr_DObject[0xf])(actor,pAVar9,pAVar9,0);
    return;
  case 1:
    actor->Speed = (double)value * 1.52587890625e-05;
    break;
  case 2:
    pVVar7 = CreateDamageFunction(value);
    actor->Damage = &pVVar7->super_VMFunction;
    break;
  case 3:
    actor->Alpha = (double)value * 1.52587890625e-05;
    break;
  case 4:
    lVar6 = 0;
    do {
      if (*(int *)((long)LegacyRenderStyleIndices + lVar6) == value) {
        actor->RenderStyle = *(FRenderStyle *)((long)LegacyRenderStyles + lVar6);
        return;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x38);
    break;
  case 5:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = S_FindSound(pcVar5);
    (actor->SeeSound).super_FSoundID.ID = iVar4;
    break;
  case 6:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = S_FindSound(pcVar5);
    (actor->AttackSound).super_FSoundID.ID = iVar4;
    break;
  case 7:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = S_FindSound(pcVar5);
    (actor->PainSound).super_FSoundID.ID = iVar4;
    break;
  case 8:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = S_FindSound(pcVar5);
    (actor->DeathSound).super_FSoundID.ID = iVar4;
    break;
  case 9:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = S_FindSound(pcVar5);
    (actor->ActiveSound).super_FSoundID.ID = iVar4;
    break;
  case 10:
    uVar3 = (actor->flags).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xffffffdf;
    }
    else {
      uVar3 = uVar3 | 0x20;
    }
    goto LAB_0050e709;
  case 0xb:
    uVar3 = (actor->flags2).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xf7ffffff;
    }
    else {
      uVar3 = uVar3 | 0x8000000;
    }
    (actor->flags2).Value = uVar3;
    break;
  case 0xc:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      *(double *)&actor[1].super_DThinker.super_DObject.ObjectFlags =
           (double)value * 1.52587890625e-05;
    }
    break;
  case 0xd:
    uVar3 = (actor->flags5).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xffffff7f;
    }
    else {
      uVar3 = uVar3 | 0x80;
    }
    (actor->flags5).Value = uVar3;
    break;
  case 0xe:
    uVar3 = (actor->flags4).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xbfffffff;
    }
    else {
      uVar3 = uVar3 | 0x40000000;
    }
    (actor->flags4).Value = uVar3;
    break;
  case 0xf:
    actor->Gravity = (double)value * 1.52587890625e-05;
    break;
  case 0x10:
    uVar3 = (actor->flags).Value;
    if ((uVar3 & 0x8400000) == 0x400000) {
      level.total_monsters = level.total_monsters + -1;
    }
    uVar8 = (uint)(value != 0) << 0x1b;
    (actor->flags).Value = uVar8 | uVar3 & 0xf7ffffff;
    if ((uVar8 | uVar3 & 0x400000) == 0x400000) {
      level.total_monsters = level.total_monsters + 1;
    }
    break;
  case 0x11:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      *(int *)&actor[1].super_DThinker.super_DObject._vptr_DObject = value;
    }
    break;
  case 0x12:
    uVar3 = (actor->flags).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xfffdffff;
    }
    else {
      uVar3 = uVar3 | 0x20000;
    }
LAB_0050e709:
    (actor->flags).Value = uVar3;
    break;
  case 0x13:
    uVar3 = (actor->flags3).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xfffbffff;
    }
    else {
      uVar3 = uVar3 | 0x40000;
    }
    (actor->flags3).Value = uVar3;
    break;
  case 0x14:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = FName::NameManager::FindName(&FName::NameData,pcVar5,false);
    (actor->Species).super_FName.Index = iVar4;
    break;
  case 0x15:
    pcVar5 = FBehavior::StaticLookupString(value);
    AActor::SetTag(actor,pcVar5);
    return;
  case 0x16:
    actor->Score = value;
    break;
  case 0x17:
    uVar3 = (actor->flags6).Value;
    if (value == 0) {
      uVar3 = uVar3 & 0xfffeffff;
    }
    else {
      uVar3 = uVar3 | 0x10000;
    }
    (actor->flags6).Value = uVar3;
    break;
  case 0x18:
    actor->DamageFactor = (double)value * 1.52587890625e-05;
    break;
  case 0x19:
    if (value != 0) {
      for (pAVar9 = AActor::TIDHash[value & 0x7f]; pAVar9 != (AActor *)0x0; pAVar9 = pAVar9->inext)
      {
        if (pAVar9->tid == value) goto LAB_0050e6c5;
      }
    }
    pAVar9 = (AActor *)0x0;
LAB_0050e6c5:
    DoSetMaster(actor,pAVar9);
    return;
  case 0x1d:
    (actor->Scale).X = (double)value * 1.52587890625e-05;
    break;
  case 0x1e:
    (actor->Scale).Y = (double)value * 1.52587890625e-05;
    break;
  case 0x20:
    actor->Mass = value;
    break;
  case 0x21:
    actor->accuracy = value;
    break;
  case 0x22:
    actor->stamina = value;
    break;
  case 0x25:
    actor->reactiontime = value;
    break;
  case 0x26:
    actor->meleerange = (double)value * 1.52587890625e-05;
    break;
  case 0x27:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      actor[1].sprev = (AActor **)((double)value * 1.52587890625e-05);
      if (actor->player != (player_t *)0x0) {
        actor->player->viewheight = (double)value * 1.52587890625e-05;
      }
    }
    break;
  case 0x28:
    bVar2 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      actor[1].SpriteAngle.Degrees = (double)value * 1.52587890625e-05;
    }
    break;
  case 0x29:
    AActor::SetShade(actor,value);
    return;
  case 0x2a:
    actor->Friction = (double)value * 1.52587890625e-05;
    break;
  case 0x2b:
    actor->DamageMultiply = (double)value * 1.52587890625e-05;
    break;
  case 0x2c:
    actor->MaxStepHeight = (double)value * 1.52587890625e-05;
    break;
  case 0x2d:
    actor->MaxDropOffHeight = (double)value * 1.52587890625e-05;
    break;
  case 0x2e:
    pcVar5 = FBehavior::StaticLookupString(value);
    iVar4 = FName::NameManager::FindName(&FName::NameData,pcVar5,false);
    (actor->DamageType).super_FName.Index = iVar4;
  }
  return;
}

Assistant:

void DLevelScript::DoSetActorProperty (AActor *actor, int property, int value)
{
	if (actor == NULL)
	{
		return;
	}
	switch (property)
	{
	case APROP_Health:
		// Don't alter the health of dead things.
		if (actor->health <= 0 || (actor->player != NULL && actor->player->playerstate == PST_DEAD))
		{
			break;
		}
		actor->health = value;
		if (actor->player != NULL)
		{
			actor->player->health = value;
		}
		// If the health is set to a non-positive value, properly kill the actor.
		if (value <= 0)
		{
			actor->Die(activator, activator);
		}
		break;

	case APROP_Speed:
		actor->Speed = ACSToDouble(value);
		break;

	case APROP_Damage:
		actor->Damage = CreateDamageFunction(value);
		break;

	case APROP_Alpha:
		actor->Alpha = ACSToDouble(value);
		break;

	case APROP_RenderStyle:
		for(int i=0; LegacyRenderStyleIndices[i] >= 0; i++)
		{
			if (LegacyRenderStyleIndices[i] == value)
			{
				actor->RenderStyle = ERenderStyle(i);
				break;
			}
		}
		break;

	case APROP_Ambush:
		if (value) actor->flags |= MF_AMBUSH; else actor->flags &= ~MF_AMBUSH;
		break;

	case APROP_Dropped:
		if (value) actor->flags |= MF_DROPPED; else actor->flags &= ~MF_DROPPED;
		break;

	case APROP_Invulnerable:
		if (value) actor->flags2 |= MF2_INVULNERABLE; else actor->flags2 &= ~MF2_INVULNERABLE;
		break;

	case APROP_Notarget:
		if (value) actor->flags3 |= MF3_NOTARGET; else actor->flags3 &= ~MF3_NOTARGET;
		break;

	case APROP_Notrigger:
		if (value) actor->flags6 |= MF6_NOTRIGGER; else actor->flags6 &= ~MF6_NOTRIGGER;
		break;

	case APROP_JumpZ:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
			static_cast<APlayerPawn *>(actor)->JumpZ = ACSToDouble(value);
		break; 	// [GRB]

	case APROP_ChaseGoal:
		if (value)
			actor->flags5 |= MF5_CHASEGOAL;
		else
			actor->flags5 &= ~MF5_CHASEGOAL;
		break;

	case APROP_Frightened:
		if (value)
			actor->flags4 |= MF4_FRIGHTENED;
		else
			actor->flags4 &= ~MF4_FRIGHTENED;
		break;

	case APROP_Friendly:
		if (actor->CountsAsKill()) level.total_monsters--;
		if (value)
		{
			actor->flags |= MF_FRIENDLY;
		}
		else
		{
			actor->flags &= ~MF_FRIENDLY;
		}
		if (actor->CountsAsKill()) level.total_monsters++;
		break;


	case APROP_SpawnHealth:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
		{
			static_cast<APlayerPawn *>(actor)->MaxHealth = value;
		}
		break;

	case APROP_Gravity:
		actor->Gravity = ACSToDouble(value);
		break;

	case APROP_SeeSound:
		actor->SeeSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_AttackSound:
		actor->AttackSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_PainSound:
		actor->PainSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_DeathSound:
		actor->DeathSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_ActiveSound:
		actor->ActiveSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_Species:
		actor->Species = FBehavior::StaticLookupString(value);
		break;

	case APROP_Score:
		actor->Score = value;
		break;

	case APROP_NameTag:
		actor->SetTag(FBehavior::StaticLookupString(value));
		break;

	case APROP_DamageFactor:
		actor->DamageFactor = ACSToDouble(value);
		break;

	case APROP_DamageMultiplier:
		actor->DamageMultiply = ACSToDouble(value);
		break;

	case APROP_MasterTID:
		AActor *other;
		other = SingleActorFromTID (value, NULL);
		DoSetMaster (actor, other);
		break;

	case APROP_ScaleX:
		actor->Scale.X = ACSToDouble(value);
		break;

	case APROP_ScaleY:
		actor->Scale.Y = ACSToDouble(value);
		break;

	case APROP_Mass:
		actor->Mass = value;
		break;

	case APROP_Accuracy:
		actor->accuracy = value;
		break;

	case APROP_Stamina:
		actor->stamina = value;
		break;

	case APROP_ReactionTime:
		actor->reactiontime = value;
		break;

	case APROP_MeleeRange:
		actor->meleerange = ACSToDouble(value);
		break;

	case APROP_ViewHeight:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
		{
			static_cast<APlayerPawn *>(actor)->ViewHeight = ACSToDouble(value);
			if (actor->player != NULL)
			{
				actor->player->viewheight = ACSToDouble(value);
			}
		}
		break;

	case APROP_AttackZOffset:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
			static_cast<APlayerPawn *>(actor)->AttackZOffset = ACSToDouble(value);
		break;

	case APROP_StencilColor:
		actor->SetShade(value);
		break;

	case APROP_Friction:
		actor->Friction = ACSToDouble(value);
		break;

	case APROP_MaxStepHeight:
		actor->MaxStepHeight = ACSToDouble(value);
		break;

	case APROP_MaxDropOffHeight:
		actor->MaxDropOffHeight = ACSToDouble(value);
		break;

	case APROP_DamageType:
		actor->DamageType = FBehavior::StaticLookupString(value);
		break;

	default:
		// do nothing.
		break;
	}
}